

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utest.cpp
# Opt level: O0

void __thiscall
UtestShell::assertCstrNoCaseContains
          (UtestShell *this,char *expected,char *actual,char *text,char *fileName,int lineNumber)

{
  bool bVar1;
  TestResult *pTVar2;
  long in_RDX;
  long in_RSI;
  SimpleString *in_RDI;
  SimpleString *in_R8;
  undefined4 in_R9D;
  UtestShell *in_stack_fffffffffffffec8;
  SimpleString *in_stack_fffffffffffffed0;
  SimpleString *in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  SimpleString *in_stack_ffffffffffffff00;
  int in_stack_ffffffffffffff0c;
  char *in_stack_ffffffffffffff10;
  UtestShell *in_stack_ffffffffffffff18;
  ContainsFailure *in_stack_ffffffffffffff20;
  SimpleString *in_stack_ffffffffffffff30;
  UtestShell local_98;
  undefined4 local_2c;
  SimpleString *local_28;
  long local_18;
  long local_10;
  
  local_2c = in_R9D;
  local_28 = in_R8;
  local_18 = in_RDX;
  local_10 = in_RSI;
  pTVar2 = getTestResult(in_stack_fffffffffffffec8);
  (*pTVar2->_vptr_TestResult[10])();
  if ((local_18 != 0) || (local_10 != 0)) {
    if ((local_18 == 0) || (local_10 == 0)) {
      SimpleString::SimpleString(in_stack_fffffffffffffed0,(char *)in_stack_fffffffffffffec8);
      SimpleString::SimpleString(in_stack_fffffffffffffed0,(char *)in_stack_fffffffffffffec8);
      SimpleString::SimpleString(in_stack_fffffffffffffed0,(char *)in_stack_fffffffffffffec8);
      in_stack_fffffffffffffec8 = &local_98;
      ContainsFailure::ContainsFailure
                (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                 in_stack_ffffffffffffff0c,in_stack_ffffffffffffff00,in_RDI,
                 in_stack_ffffffffffffff30);
      (**(code **)(in_RDI->buffer_ + 0x120))(in_RDI,&local_98.next_);
      ContainsFailure::~ContainsFailure((ContainsFailure *)0x218e85);
      SimpleString::~SimpleString((SimpleString *)0x218e92);
      SimpleString::~SimpleString((SimpleString *)0x218e9f);
      SimpleString::~SimpleString((SimpleString *)0x218eac);
      in_stack_fffffffffffffee8 = local_28;
      in_stack_fffffffffffffef4 = local_2c;
    }
    SimpleString::SimpleString(in_stack_fffffffffffffed0,(char *)in_stack_fffffffffffffec8);
    SimpleString::SimpleString(in_stack_fffffffffffffed0,(char *)in_stack_fffffffffffffec8);
    bVar1 = SimpleString::containsNoCase
                      ((SimpleString *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0)
                       ,in_stack_fffffffffffffee8);
    SimpleString::~SimpleString((SimpleString *)0x218f9e);
    SimpleString::~SimpleString((SimpleString *)0x218fab);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      SimpleString::SimpleString(in_stack_fffffffffffffed0,(char *)in_stack_fffffffffffffec8);
      SimpleString::SimpleString(in_stack_fffffffffffffed0,(char *)in_stack_fffffffffffffec8);
      SimpleString::SimpleString(in_stack_fffffffffffffed0,(char *)in_stack_fffffffffffffec8);
      ContainsFailure::ContainsFailure
                (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                 in_stack_ffffffffffffff0c,in_stack_ffffffffffffff00,in_RDI,
                 in_stack_ffffffffffffff30);
      (**(code **)(in_RDI->buffer_ + 0x120))(in_RDI,&stack0xffffffffffffff18);
      ContainsFailure::~ContainsFailure((ContainsFailure *)0x21905b);
      SimpleString::~SimpleString((SimpleString *)0x219065);
      SimpleString::~SimpleString((SimpleString *)0x21906f);
      SimpleString::~SimpleString((SimpleString *)0x219079);
    }
  }
  return;
}

Assistant:

void UtestShell::assertCstrNoCaseContains(const char* expected, const char* actual, const char* text, const char* fileName, int lineNumber)
{
    getTestResult()->countCheck();
    if (actual == 0 && expected == 0) return;
    if(actual == 0 || expected == 0)
        failWith(ContainsFailure(this, fileName, lineNumber, expected, actual, text));
    if (!SimpleString(actual).containsNoCase(expected))
        failWith(ContainsFailure(this, fileName, lineNumber, expected, actual, text));
}